

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.cc
# Opt level: O1

const_iterator __thiscall PcodeOpBank::end(PcodeOpBank *this,Address *addr)

{
  bool bVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  SeqNum local_30;
  
  local_30.pc.base = addr->base;
  local_30.pc.offset = addr->offset;
  local_30.uniq = 0xffffffff;
  p_Var3 = (this->optree)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = &(this->optree)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var3 != (_Base_ptr)0x0) {
    do {
      bVar1 = SeqNum::operator<(&local_30,(SeqNum *)(p_Var3 + 1));
      if (bVar1) {
        p_Var2 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[!bVar1];
    } while (p_Var3 != (_Base_ptr)0x0);
  }
  return (const_iterator)p_Var2;
}

Assistant:

PcodeOpTree::const_iterator PcodeOpBank::end(const Address &addr) const

{
  return optree.upper_bound(SeqNum(addr,~((uintm)0)));
}